

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

hts_idx_t * bcf_index(htsFile *fp,int min_shift)

{
  int iVar1;
  bcf_hdr_t *h_00;
  hts_idx_t *idx_00;
  bcf1_t *v;
  int local_54;
  int ret;
  int nids;
  int64_t s;
  int64_t max_len;
  bcf_hdr_t *h;
  hts_idx_t *idx;
  bcf1_t *b;
  int local_20;
  int i;
  int n_lvls;
  int min_shift_local;
  htsFile *fp_local;
  
  s = 0;
  h_00 = bcf_hdr_read(fp);
  if (h_00 != (bcf_hdr_t *)0x0) {
    local_54 = 0;
    for (b._4_4_ = 0; b._4_4_ < h_00->n[1]; b._4_4_ = b._4_4_ + 1) {
      if (h_00->id[1][b._4_4_].val != (bcf_idinfo_t *)0x0) {
        if ((ulong)s < (ulong)(h_00->id[1][b._4_4_].val)->info[0]) {
          s = (int64_t)(h_00->id[1][b._4_4_].val)->info[0];
        }
        local_54 = local_54 + 1;
      }
    }
    if (s == 0) {
      s = 0x7fffffff;
    }
    local_20 = 0;
    for (_ret = (long)(1 << ((byte)min_shift & 0x1f)); _ret < s + 0x100; _ret = _ret << 3) {
      local_20 = local_20 + 1;
    }
    idx_00 = hts_idx_init(local_54,0,
                          ((fp->fp).bgzf)->block_address << 0x10 |
                          (long)(int)(((fp->fp).bgzf)->block_offset & 0xffff),min_shift,local_20);
    v = bcf_init();
    do {
      iVar1 = bcf_read(fp,h_00,v);
      if (iVar1 < 0) {
        hts_idx_finish(idx_00,((fp->fp).bgzf)->block_address << 0x10 |
                              (long)(int)(((fp->fp).bgzf)->block_offset & 0xffff));
        bcf_destroy(v);
        bcf_hdr_destroy(h_00);
        return idx_00;
      }
      iVar1 = hts_idx_push(idx_00,v->rid,v->pos,v->pos + v->rlen,
                           ((fp->fp).bgzf)->block_address << 0x10 |
                           (long)(int)(((fp->fp).bgzf)->block_offset & 0xffff),1);
    } while (-1 < iVar1);
    bcf_destroy(v);
    hts_idx_destroy(idx_00);
  }
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *bcf_index(htsFile *fp, int min_shift)
{
    int n_lvls, i;
    bcf1_t *b;
    hts_idx_t *idx;
    bcf_hdr_t *h;
    int64_t max_len = 0, s;
    h = bcf_hdr_read(fp);
    if ( !h ) return NULL;
    int nids = 0;
    for (i = 0; i < h->n[BCF_DT_CTG]; ++i)
    {
        if ( !h->id[BCF_DT_CTG][i].val ) continue;
        if ( max_len < h->id[BCF_DT_CTG][i].val->info[0] ) max_len = h->id[BCF_DT_CTG][i].val->info[0];
        nids++;
    }
    if ( !max_len ) max_len = ((int64_t)1<<31) - 1;  // In case contig line is broken.
    max_len += 256;
    for (n_lvls = 0, s = 1<<min_shift; max_len > s; ++n_lvls, s <<= 3);
    idx = hts_idx_init(nids, HTS_FMT_CSI, bgzf_tell(fp->fp.bgzf), min_shift, n_lvls);
    b = bcf_init1();
    while (bcf_read1(fp,h, b) >= 0) {
        int ret;
        ret = hts_idx_push(idx, b->rid, b->pos, b->pos + b->rlen, bgzf_tell(fp->fp.bgzf), 1);
        if (ret < 0)
        {
            bcf_destroy1(b);
            hts_idx_destroy(idx);
            return NULL;
        }
    }
    hts_idx_finish(idx, bgzf_tell(fp->fp.bgzf));
    bcf_destroy1(b);
    bcf_hdr_destroy(h);
    return idx;
}